

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

bool __thiscall
capnp::SchemaLoader::CompatibilityChecker::shouldReplace
          (CompatibilityChecker *this,Reader *existingNode,Reader *replacement,
          bool preferReplacementIfEquivalent)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  int iVar7;
  undefined4 uVar8;
  StructDataBitCount SVar9;
  bool bVar10;
  ArrayPtr<const_char> AVar11;
  anon_class_8_1_47aff82b _kjContextFunc635;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:634:5)>
  _kjContext635;
  anon_class_8_1_47aff82b local_80;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:634:5)>
  local_78;
  
  pSVar1 = (existingNode->_reader).segment;
  pCVar2 = (existingNode->_reader).capTable;
  pvVar3 = (existingNode->_reader).data;
  pWVar4 = (existingNode->_reader).pointers;
  SVar5 = (existingNode->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(existingNode->_reader).field_0x26;
  iVar7 = (existingNode->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(existingNode->_reader).field_0x2c;
  (this->existingNode)._reader.dataSize = (existingNode->_reader).dataSize;
  (this->existingNode)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->existingNode)._reader.field_0x26 = uVar6;
  (this->existingNode)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->existingNode)._reader.field_0x2c = uVar8;
  (this->existingNode)._reader.data = pvVar3;
  (this->existingNode)._reader.pointers = pWVar4;
  (this->existingNode)._reader.segment = pSVar1;
  (this->existingNode)._reader.capTable = pCVar2;
  pCVar2 = (replacement->_reader).capTable;
  pvVar3 = (replacement->_reader).data;
  pWVar4 = (replacement->_reader).pointers;
  SVar9 = (replacement->_reader).dataSize;
  SVar5 = (replacement->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(replacement->_reader).field_0x26;
  iVar7 = (replacement->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(replacement->_reader).field_0x2c;
  (this->replacementNode)._reader.segment = (replacement->_reader).segment;
  (this->replacementNode)._reader.capTable = pCVar2;
  (this->replacementNode)._reader.data = pvVar3;
  (this->replacementNode)._reader.pointers = pWVar4;
  (this->replacementNode)._reader.dataSize = SVar9;
  (this->replacementNode)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->replacementNode)._reader.field_0x26 = uVar6;
  (this->replacementNode)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->replacementNode)._reader.field_0x2c = uVar8;
  local_80.existingNode = existingNode;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:634:5)>
  ::ContextImpl(&local_78,&local_80);
  AVar11 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(existingNode);
  (this->nodeName).super_StringPtr.content = AVar11;
  this->compatibility = EQUIVALENT;
  checkCompatibility(this,existingNode,replacement);
  bVar10 = this->compatibility == NEWER;
  if (preferReplacementIfEquivalent) {
    bVar10 = this->compatibility != OLDER;
  }
  kj::_::Debug::Context::~Context(&local_78.super_Context);
  return bVar10;
}

Assistant:

bool shouldReplace(const schema::Node::Reader& existingNode,
                     const schema::Node::Reader& replacement,
                     bool preferReplacementIfEquivalent) {
    this->existingNode = existingNode;
    this->replacementNode = replacement;

    KJ_CONTEXT("checking compatibility with previously-loaded node of the same id",
               existingNode.getDisplayName());

    KJ_DREQUIRE(existingNode.getId() == replacement.getId());

    nodeName = existingNode.getDisplayName();
    compatibility = EQUIVALENT;

    checkCompatibility(existingNode, replacement);

    // Prefer the newer schema.
    return preferReplacementIfEquivalent ? compatibility != OLDER : compatibility == NEWER;
  }